

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::LdHeapArgumentsImpl<true>
          (InterpreterStackFrame *this,Var argsArray,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *funcCallee;
  Var pvVar4;
  RecyclableObject *frameObj;
  
  frameObj = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
  if (((frameObj != (RecyclableObject *)argsArray & *(byte *)(*(long *)(this + 0x88) + 0x170)) == 1)
     && (frameObj = *(RecyclableObject **)(this + 0x58), frameObj == (RecyclableObject *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x24ce,"(frameObj)","frameObj");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    frameObj = (RecyclableObject *)0x0;
  }
  funcCallee = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
  pvVar4 = JavascriptOperators::LoadHeapArguments
                     (funcCallee,*(int *)(this + 0x18) - 1,(Var *)(*(long *)(this + 0x20) + 8),
                      frameObj,argsArray,scriptContext,true);
  *(Var *)(this + 0x40) = pvVar4;
  return pvVar4;
}

Assistant:

Var InterpreterStackFrame::LdHeapArgumentsImpl(Var argsArray, ScriptContext* scriptContext)
    {
        Var frameObj;
        if (m_functionBody->HasScopeObject() && argsArray != scriptContext->GetLibrary()->GetNull())
        {
            frameObj = this->localClosure;
            Assert(frameObj);
        }
        else
        {
            frameObj = scriptContext->GetLibrary()->GetNull();
        }
        Var args = JavascriptOperators::LoadHeapArguments(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, &this->m_inParams[1], frameObj, argsArray, scriptContext, letArgs);
        this->m_arguments = args;
        return args;
    }